

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

Optimizer * __thiscall
spvtools::Optimizer::RegisterPerformancePasses(Optimizer *this,bool preserve_interface)

{
  __uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  _Var1;
  __uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_190;
  PassToken local_188;
  PassToken local_180;
  PassToken local_178;
  PassToken local_170;
  PassToken local_168;
  PassToken local_160;
  PassToken local_158;
  PassToken local_150;
  PassToken local_148;
  PassToken local_140;
  PassToken local_138;
  PassToken local_130;
  PassToken local_128;
  PassToken local_120;
  PassToken local_118;
  PassToken local_110;
  PassToken local_108;
  PassToken local_100;
  PassToken local_f8;
  PassToken local_f0;
  PassToken local_e8;
  PassToken local_e0;
  PassToken local_d8;
  PassToken local_d0;
  PassToken local_c8;
  PassToken local_c0;
  PassToken local_b8;
  PassToken local_b0;
  PassToken local_a8;
  PassToken local_a0;
  PassToken local_98;
  PassToken local_90;
  PassToken local_88;
  PassToken local_80;
  PassToken local_78;
  PassToken local_70;
  PassToken local_68;
  PassToken local_60;
  PassToken local_58;
  PassToken local_50;
  PassToken local_48;
  PassToken local_40;
  PassToken local_38;
  
  CreateWrapOpKillPass();
  RegisterPass(this,&local_60);
  CreateDeadBranchElimPass();
  RegisterPass(this,&local_68);
  CreateMergeReturnPass();
  RegisterPass(this,&local_70);
  CreateInlineExhaustivePass();
  RegisterPass(this,&local_78);
  CreateEliminateDeadFunctionsPass();
  RegisterPass(this,&local_80);
  CreateAggressiveDCEPass((spvtools *)&local_88,preserve_interface);
  RegisterPass(this,&local_88);
  CreatePrivateToLocalPass();
  RegisterPass(this,&local_90);
  CreateLocalSingleBlockLoadStoreElimPass();
  RegisterPass(this,&local_98);
  CreateLocalSingleStoreElimPass();
  RegisterPass(this,&local_a0);
  CreateAggressiveDCEPass((spvtools *)&local_a8,preserve_interface);
  RegisterPass(this,&local_a8);
  CreateScalarReplacementPass((spvtools *)&local_b0,100);
  RegisterPass(this,&local_b0);
  CreateLocalAccessChainConvertPass();
  RegisterPass(this,&local_b8);
  CreateLocalSingleBlockLoadStoreElimPass();
  RegisterPass(this,&local_c0);
  CreateLocalSingleStoreElimPass();
  RegisterPass(this,&local_c8);
  CreateAggressiveDCEPass((spvtools *)&local_d0,preserve_interface);
  RegisterPass(this,&local_d0);
  CreateLocalMultiStoreElimPass();
  RegisterPass(this,&local_d8);
  CreateAggressiveDCEPass((spvtools *)&local_e0,preserve_interface);
  RegisterPass(this,&local_e0);
  CreateCCPPass();
  RegisterPass(this,&local_e8);
  CreateAggressiveDCEPass((spvtools *)&local_f0,preserve_interface);
  RegisterPass(this,&local_f0);
  CreateLoopUnrollPass((spvtools *)&local_f8,true,0);
  RegisterPass(this,&local_f8);
  CreateDeadBranchElimPass();
  RegisterPass(this,&local_100);
  CreateRedundancyEliminationPass();
  RegisterPass(this,&local_108);
  CreateCombineAccessChainsPass();
  RegisterPass(this,&local_110);
  CreateSimplificationPass();
  RegisterPass(this,&local_118);
  CreateScalarReplacementPass((spvtools *)&local_120,100);
  RegisterPass(this,&local_120);
  CreateLocalAccessChainConvertPass();
  RegisterPass(this,&local_128);
  CreateLocalSingleBlockLoadStoreElimPass();
  RegisterPass(this,&local_130);
  CreateLocalSingleStoreElimPass();
  RegisterPass(this,&local_138);
  CreateAggressiveDCEPass((spvtools *)&local_140,preserve_interface);
  RegisterPass(this,&local_140);
  CreateSSARewritePass();
  RegisterPass(this,&local_148);
  CreateAggressiveDCEPass((spvtools *)&local_150,preserve_interface);
  RegisterPass(this,&local_150);
  CreateVectorDCEPass();
  RegisterPass(this,&local_158);
  MakeUnique<spvtools::opt::DeadInsertElimPass>();
  local_160.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )operator_new(8);
  _Var1._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       local_190._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  local_190._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (tuple<spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )(_Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )0x0;
  *(tuple<spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
    *)local_160.impl_._M_t.
      super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       _Var1._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  RegisterPass(this,&local_160);
  CreateDeadBranchElimPass();
  RegisterPass(this,&local_168);
  CreateSimplificationPass();
  RegisterPass(this,&local_170);
  CreateIfConversionPass();
  RegisterPass(this,&local_178);
  MakeUnique<spvtools::opt::CopyPropagateArrays>();
  local_180.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )operator_new(8);
  _Var1._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       local_190._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  local_190._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (tuple<spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )(_Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )0x0;
  *(tuple<spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
    *)local_180.impl_._M_t.
      super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       _Var1._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  RegisterPass(this,&local_180);
  CreateReduceLoadSizePass((spvtools *)&local_190,0.9);
  RegisterPass(this,(PassToken *)&local_190);
  CreateAggressiveDCEPass((spvtools *)&local_188,preserve_interface);
  RegisterPass(this,&local_188);
  CreateBlockMergePass();
  RegisterPass(this,&local_38);
  CreateRedundancyEliminationPass();
  RegisterPass(this,&local_40);
  CreateDeadBranchElimPass();
  RegisterPass(this,&local_48);
  CreateBlockMergePass();
  RegisterPass(this,&local_50);
  CreateSimplificationPass();
  RegisterPass(this,&local_58);
  PassToken::~PassToken(&local_58);
  PassToken::~PassToken(&local_50);
  PassToken::~PassToken(&local_48);
  PassToken::~PassToken(&local_40);
  PassToken::~PassToken(&local_38);
  PassToken::~PassToken(&local_188);
  PassToken::~PassToken((PassToken *)&local_190);
  PassToken::~PassToken(&local_180);
  PassToken::~PassToken(&local_178);
  PassToken::~PassToken(&local_170);
  PassToken::~PassToken(&local_168);
  PassToken::~PassToken(&local_160);
  PassToken::~PassToken(&local_158);
  PassToken::~PassToken(&local_150);
  PassToken::~PassToken(&local_148);
  PassToken::~PassToken(&local_140);
  PassToken::~PassToken(&local_138);
  PassToken::~PassToken(&local_130);
  PassToken::~PassToken(&local_128);
  PassToken::~PassToken(&local_120);
  PassToken::~PassToken(&local_118);
  PassToken::~PassToken(&local_110);
  PassToken::~PassToken(&local_108);
  PassToken::~PassToken(&local_100);
  PassToken::~PassToken(&local_f8);
  PassToken::~PassToken(&local_f0);
  PassToken::~PassToken(&local_e8);
  PassToken::~PassToken(&local_e0);
  PassToken::~PassToken(&local_d8);
  PassToken::~PassToken(&local_d0);
  PassToken::~PassToken(&local_c8);
  PassToken::~PassToken(&local_c0);
  PassToken::~PassToken(&local_b8);
  PassToken::~PassToken(&local_b0);
  PassToken::~PassToken(&local_a8);
  PassToken::~PassToken(&local_a0);
  PassToken::~PassToken(&local_98);
  PassToken::~PassToken(&local_90);
  PassToken::~PassToken(&local_88);
  PassToken::~PassToken(&local_80);
  PassToken::~PassToken(&local_78);
  PassToken::~PassToken(&local_70);
  PassToken::~PassToken(&local_68);
  PassToken::~PassToken(&local_60);
  return this;
}

Assistant:

Optimizer& Optimizer::RegisterPerformancePasses(bool preserve_interface) {
  return RegisterPass(CreateWrapOpKillPass())
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateMergeReturnPass())
      .RegisterPass(CreateInlineExhaustivePass())
      .RegisterPass(CreateEliminateDeadFunctionsPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreatePrivateToLocalPass())
      .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateScalarReplacementPass())
      .RegisterPass(CreateLocalAccessChainConvertPass())
      .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateLocalMultiStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateCCPPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateLoopUnrollPass(true))
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateRedundancyEliminationPass())
      .RegisterPass(CreateCombineAccessChainsPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateScalarReplacementPass())
      .RegisterPass(CreateLocalAccessChainConvertPass())
      .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateSSARewritePass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateVectorDCEPass())
      .RegisterPass(CreateDeadInsertElimPass())
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateIfConversionPass())
      .RegisterPass(CreateCopyPropagateArraysPass())
      .RegisterPass(CreateReduceLoadSizePass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateBlockMergePass())
      .RegisterPass(CreateRedundancyEliminationPass())
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateBlockMergePass())
      .RegisterPass(CreateSimplificationPass());
}